

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
node::anon_unknown_2::NodeImpl::handleMessageBox(NodeImpl *this,MessageBoxFn fn)

{
  function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
  fn_00;
  function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
  *in_RDX;
  long in_FS_OFFSET;
  connection cVar1;
  _Any_data in_stack_ffffffffffffffb8;
  _Manager_type in_stack_ffffffffffffffc8;
  _Invoker_type in_stack_ffffffffffffffd0;
  CClientUIInterface local_28 [8];
  weak_count local_20;
  weak_count local_18;
  
  local_18.pi_ = *(sp_counted_base **)(in_FS_OFFSET + 0x28);
  std::
  function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
  ::function((function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
              *)&stack0xffffffffffffffb8,in_RDX);
  fn_00.super__Function_base._M_manager = in_stack_ffffffffffffffc8;
  fn_00.super__Function_base._M_functor = in_stack_ffffffffffffffb8;
  fn_00._M_invoker = in_stack_ffffffffffffffd0;
  cVar1 = CClientUIInterface::ThreadSafeMessageBox_connect(local_28,fn_00);
  cVar1._weak_connection_body.px = (element_type *)local_28;
  interfaces::MakeSignalHandler((interfaces *)this,cVar1);
  boost::detail::weak_count::~weak_count(&local_20);
  if (in_stack_ffffffffffffffc8 != (_Manager_type)0x0) {
    (*in_stack_ffffffffffffffc8)
              ((_Any_data *)&stack0xffffffffffffffb8,(_Any_data *)&stack0xffffffffffffffb8,
               __destroy_functor);
  }
  if (*(sp_counted_base **)(in_FS_OFFSET + 0x28) == local_18.pi_) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleMessageBox(MessageBoxFn fn) override
    {
        return MakeSignalHandler(::uiInterface.ThreadSafeMessageBox_connect(fn));
    }